

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O2

int PAL_iswprint(char16_t c)

{
  int iVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    iVar1 = proxy_iswprint(c);
    if (PAL_InitializeChakraCoreCalled != false) {
      return iVar1;
    }
  }
  abort();
}

Assistant:

int
__cdecl
PAL_iswprint( char16_t c )
{
    int ret;


    PERF_ENTRY(iswprint);
    ENTRY("PAL_iswprint (%#X)\n", c);

    ret = proxy_iswprint(c);

    LOGEXIT("PAL_iswprint returns %d\n", ret);
    PERF_EXIT(iswprint);
    return (ret);
}